

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

bool __thiscall Json::StyledStreamWriter::isMultineArray(StyledStreamWriter *this,Value *value)

{
  byte bVar1;
  bool bVar2;
  ArrayIndex AVar3;
  ArrayIndex AVar4;
  int iVar5;
  Value *pVVar6;
  bool bVar7;
  int local_38;
  int local_34;
  int index_1;
  int lineLength;
  Value *childValue;
  int index;
  bool isMultiLine;
  int size;
  Value *value_local;
  StyledStreamWriter *this_local;
  
  AVar3 = Value::size(value);
  bVar2 = this->rightMargin_ <= (int)(AVar3 * 3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  childValue._4_4_ = 0;
  do {
    bVar1 = 0;
    if (childValue._4_4_ < (int)AVar3) {
      bVar1 = bVar2 ^ 1;
    }
    if (bVar1 == 0) {
      if (bVar2 == false) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&this->childValues_,(long)(int)AVar3);
        this->addChildValues_ = true;
        local_34 = (AVar3 - 1) * 2 + 4;
        for (local_38 = 0; local_38 < (int)AVar3; local_38 = local_38 + 1) {
          pVVar6 = Value::operator[](value,local_38);
          writeValue(this,pVVar6);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&this->childValues_,(long)local_38);
          iVar5 = std::__cxx11::string::length();
          local_34 = iVar5 + local_34;
        }
        this->addChildValues_ = false;
        bVar2 = this->rightMargin_ <= local_34;
      }
      return bVar2;
    }
    pVVar6 = Value::operator[](value,childValue._4_4_);
    bVar7 = bVar2 == false;
    bVar2 = true;
    if (bVar7) {
      bVar2 = Value::isArray(pVVar6);
      if (!bVar2) {
        bVar7 = Value::isObject(pVVar6);
        bVar2 = false;
        if (!bVar7) goto LAB_008eaab8;
      }
      AVar4 = Value::size(pVVar6);
      bVar2 = AVar4 != 0;
    }
LAB_008eaab8:
    childValue._4_4_ = childValue._4_4_ + 1;
  } while( true );
}

Assistant:

bool StyledStreamWriter::isMultineArray(const Value& value) {
  int size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (int index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine =
        isMultiLine || ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    int lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (int index = 0; index < size; ++index) {
      writeValue(value[index]);
      lineLength += int(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}